

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut>::Deserialize
          (JsonClassBase<cfd::api::json::DecodeRawTransactionTxOut> *this,string *value)

{
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  long *in_RDI;
  UniValue object;
  UniValue local_68;
  int local_10;
  
  local_10 = in_ESI;
  UniValue::UniValue(&local_68);
  UniValue::read(&local_68,local_10,__buf,in_RCX);
  (**(code **)(*in_RDI + 0x40))(in_RDI,&local_68);
  UniValue::~UniValue(&local_68);
  return;
}

Assistant:

virtual void Deserialize(const std::string& value) {
    UniValue object;
    object.read(value);
    DeserializeUniValue(object);
  }